

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashSet.hpp
# Opt level: O0

void __thiscall HashSet<String>::clear(HashSet<String> *this)

{
  Item *end;
  Item *i;
  HashSet<String> *this_local;
  
  for (end = *(Item **)(this + 8); end != (Item *)(this + 0x28); end = end->next) {
    Item::~Item(end);
    *end->cell = (Item *)0x0;
    end->prev = *(Item **)(this + 0x70);
    *(Item **)(this + 0x70) = end;
  }
  *(HashSet<String> **)(this + 8) = this + 0x28;
  *(undefined8 *)(this + 0x60) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  return;
}

Assistant:

void clear()
  {
    for(Item* i = _begin.item, * end = &endItem; i != end; i = i->next)
    {
      i->~Item();
      *i->cell = 0;
      i->prev = freeItem;
      freeItem = i;
    }
    _begin.item = &endItem;
    endItem.prev = 0;
    _size = 0;
  }